

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStreamBase::~cmGeneratedFileStreamBase(cmGeneratedFileStreamBase *this)

{
  cmGeneratedFileStreamBase *this_local;
  
  Close(this);
  std::__cxx11::string::~string((string *)&this->TempName);
  std::__cxx11::string::~string((string *)&this->TempExt);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmGeneratedFileStreamBase::~cmGeneratedFileStreamBase()
{
  this->Close();
}